

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O0

int SaveEXR(float *rgb,int width,int height,char *outfilename)

{
  value_type vVar1;
  reference pvVar2;
  EXRImage *pEVar3;
  EXRHeader *exr_header;
  char *__dest;
  void *__ptr;
  void *__ptr_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int ret;
  char *err;
  int i_1;
  float *image_ptr [3];
  int i;
  vector<float,_std::allocator<float>_> images [3];
  EXRImage image;
  EXRHeader header;
  size_type in_stack_fffffffffffef628;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffef630;
  EXRImage *pEVar4;
  char (*in_stack_fffffffffffef638) [16];
  ConsoleLogger *in_stack_fffffffffffef640;
  EXRImage *this;
  undefined4 in_stack_fffffffffffef648;
  undefined4 in_stack_fffffffffffef64c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffef650;
  undefined1 *puStack_10968;
  int iStack_1094c;
  int iStack_10928;
  undefined1 auStack_10918 [48];
  vector<float,_std::allocator<float>_> vStack_108e8;
  EXRImage aEStack_108d0 [2118];
  int local_4;
  
  InitEXRHeader((EXRHeader *)0x1621a2);
  InitEXRImage(aEStack_108d0);
  puStack_10968 = auStack_10918;
  do {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x1621e2);
    puStack_10968 = puStack_10968 + 0x18;
  } while ((EXRImage *)puStack_10968 != aEStack_108d0);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_fffffffffffef650,CONCAT44(in_stack_fffffffffffef64c,in_stack_fffffffffffef648)
            );
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_fffffffffffef650,CONCAT44(in_stack_fffffffffffef64c,in_stack_fffffffffffef648)
            );
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_fffffffffffef650,CONCAT44(in_stack_fffffffffffef64c,in_stack_fffffffffffef648)
            );
  for (iStack_10928 = 0; iStack_10928 < in_ESI * in_EDX; iStack_10928 = iStack_10928 + 1) {
    vVar1 = *(value_type *)(in_RDI + (long)(iStack_10928 * 3) * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)auStack_10918,(long)iStack_10928);
    *pvVar2 = vVar1;
    vVar1 = *(value_type *)(in_RDI + (long)(iStack_10928 * 3 + 1) * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(auStack_10918 + 0x18),
                        (long)iStack_10928);
    *pvVar2 = vVar1;
    vVar1 = *(value_type *)(in_RDI + (long)(iStack_10928 * 3 + 2) * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&vStack_108e8,(long)iStack_10928);
    *pvVar2 = vVar1;
  }
  std::vector<float,_std::allocator<float>_>::at
            (in_stack_fffffffffffef630,in_stack_fffffffffffef628);
  pEVar3 = (EXRImage *)
           std::vector<float,_std::allocator<float>_>::at
                     (in_stack_fffffffffffef630,in_stack_fffffffffffef628);
  exr_header = (EXRHeader *)
               std::vector<float,_std::allocator<float>_>::at
                         (in_stack_fffffffffffef630,in_stack_fffffffffffef628);
  __dest = (char *)malloc(0x330);
  strncpy(__dest,"B",0xff);
  __dest[1] = '\0';
  strncpy(__dest + 0x110,"G",0xff);
  __dest[0x111] = '\0';
  strncpy(__dest + 0x220,"R",0xff);
  __dest[0x221] = '\0';
  __ptr = malloc(0xc);
  __ptr_00 = malloc(0xc);
  for (iStack_1094c = 0; iStack_1094c < 3; iStack_1094c = iStack_1094c + 1) {
    *(undefined4 *)((long)__ptr + (long)iStack_1094c * 4) = 2;
    *(undefined4 *)((long)__ptr_00 + (long)iStack_1094c * 4) = 1;
  }
  local_4 = SaveEXRImageToFile(pEVar3,exr_header,
                               (char *)CONCAT44(in_stack_fffffffffffef64c,in_stack_fffffffffffef648)
                               ,(char **)in_stack_fffffffffffef640);
  if (local_4 == 0) {
    github111116::ConsoleLogger::info<char[16],char_const*>
              (in_stack_fffffffffffef640,in_stack_fffffffffffef638,
               (char **)in_stack_fffffffffffef630);
    free(__dest);
    free(__ptr);
    free(__ptr_00);
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"Save EXR err: %s\n",0);
  }
  pEVar3 = (EXRImage *)auStack_10918;
  this = aEStack_108d0;
  do {
    pEVar4 = (EXRImage *)&this[-1].images;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)this);
    this = pEVar4;
  } while (pEVar4 != pEVar3);
  return local_4;
}

Assistant:

int SaveEXR(const float* rgb, int width, int height, const char* outfilename) {

  EXRHeader header;
  InitEXRHeader(&header);

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = 3;

  std::vector<float> images[3];
  images[0].resize(width * height);
  images[1].resize(width * height);
  images[2].resize(width * height);

  // Split RGBRGBRGB... into R, G and B layer
  for (int i = 0; i < width * height; i++) {
    images[0][i] = rgb[3*i+0];
    images[1][i] = rgb[3*i+1];
    images[2][i] = rgb[3*i+2];
  }

  float* image_ptr[3];
  image_ptr[0] = &(images[2].at(0)); // B
  image_ptr[1] = &(images[1].at(0)); // G
  image_ptr[2] = &(images[0].at(0)); // R

  image.images = (unsigned char**)image_ptr;
  image.width = width;
  image.height = height;

  header.num_channels = 3;
  header.channels = (EXRChannelInfo *)malloc(sizeof(EXRChannelInfo) * header.num_channels);
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  strncpy(header.channels[0].name, "B", 255); header.channels[0].name[strlen("B")] = '\0';
  strncpy(header.channels[1].name, "G", 255); header.channels[1].name[strlen("G")] = '\0';
  strncpy(header.channels[2].name, "R", 255); header.channels[2].name[strlen("R")] = '\0';

  header.pixel_types = (int *)malloc(sizeof(int) * header.num_channels);
  header.requested_pixel_types = (int *)malloc(sizeof(int) * header.num_channels);
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT; // pixel type of input image
    header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_HALF; // pixel type of output image to be stored in .EXR
  }

  const char* err = NULL; // or nullptr in C++11 or later.
  int ret = SaveEXRImageToFile(&image, &header, outfilename, &err);
  if (ret != TINYEXR_SUCCESS) {
    fprintf(stderr, "Save EXR err: %s\n", err);
    // FreeEXRErrorMessage(err); // free's buffer for an error message
    return ret;
  }
  console.info("Saved exr file ", outfilename);

  // free(rgb);

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  return TINYEXR_SUCCESS;
}